

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  bool bVar1;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_170;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_c0;
  
  BrandScope::compileDeclExpression
            ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_c0,(this->localBrand).ptr
             ,source,this->resolver,implicitMethodParams);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            (&local_170,&local_c0);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&local_c0);
  if (local_170.isSet == true) {
    bVar1 = BrandedDecl::compileAsType(&local_170.field_1.value,this->errorReporter,target);
  }
  else {
    bVar1 = false;
  }
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&local_170);
  return bVar1;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_MAYBE(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl->compileAsType(errorReporter, target);
  } else {
    return false;
  }
}